

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

void * cram_flush_thread(void *arg)

{
  int iVar1;
  
  iVar1 = cram_encode_container(*arg,*(cram_container **)((long)arg + 8));
  if (iVar1 != 0) {
    fwrite("cram_encode_container failed\n",0x1d,1,_stderr);
    arg = (void *)0x0;
  }
  return arg;
}

Assistant:

void *cram_flush_thread(void *arg) {
    cram_job *j = (cram_job *)arg;

    /* Encode the container blocks and generate compression header */
    if (0 != cram_encode_container(j->fd, j->c)) {
	fprintf(stderr, "cram_encode_container failed\n");
	return NULL;
    }

    return arg;
}